

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::rk(Graph *this,char *word,char *text,int q)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  long local_50;
  longlong h;
  longlong textHash;
  longlong wordHash;
  int local_30;
  int j;
  int i;
  int textLength;
  int wordLength;
  int q_local;
  char *text_local;
  char *word_local;
  Graph *this_local;
  
  sVar3 = strlen(word);
  iVar1 = (int)sVar3;
  sVar3 = strlen(text);
  iVar2 = (int)sVar3;
  textHash = 0;
  h = 0;
  local_50 = 1;
  if (iVar1 <= iVar2) {
    for (local_30 = 0; local_30 < iVar1 + -1; local_30 = local_30 + 1) {
      local_50 = (local_50 * 0x1a) % (long)q;
    }
    for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
      textHash = (textHash * 0x1a + (long)word[local_30]) % (long)q;
      h = (h * 0x1a + (long)text[local_30]) % (long)q;
    }
    for (local_30 = 0; local_30 <= iVar2 - iVar1; local_30 = local_30 + 1) {
      if (textHash == h) {
        for (wordHash._4_4_ = 0;
            (wordHash._4_4_ < iVar1 && (text[local_30 + wordHash._4_4_] == word[wordHash._4_4_]));
            wordHash._4_4_ = wordHash._4_4_ + 1) {
        }
        if (wordHash._4_4_ == iVar1) {
          addEdge(this,local_30,local_30 + iVar1);
        }
      }
      if ((local_30 < iVar2 - iVar1) &&
         (h = ((h - text[local_30] * local_50) * 0x1a + (long)text[local_30 + iVar1]) % (long)q,
         h < 0)) {
        h = h + q;
      }
    }
  }
  return;
}

Assistant:

void Graph::rk(const char *word, const char *text, int q) {
    int wordLength = strlen(word);
    int textLength = strlen(text);
    int i,j;
    long long wordHash = 0;
    long long textHash = 0;
    long long h = 1;
    if(wordLength>textLength){
        return;
    }
    for ( i = 0; i < wordLength-1; i++) {
        h = (h * alphabet) % q;
    }
    for ( i = 0; i < wordLength; i++) {
        wordHash = (alphabet*wordHash + word[i])%q;
        textHash = (alphabet*textHash + text[i])%q;
    }
    for ( i = 0; i <= textLength - wordLength; i++) {
        if ( wordHash == textHash ) {
            for ( j = 0; j < wordLength; j++) {
                if (text[i+j] != word[j]) {
                    break;
                }
            }
            if (j == wordLength) {
                addEdge(i, i + wordLength);
            }
        }
        if ( i < textLength-wordLength ) {
            textHash = (alphabet*(textHash - text[i]*h) + text[i+wordLength])%q;
            if (textHash < 0)
                textHash = (textHash + q);
        }
    }
}